

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::PathTypeSingleSuccessorInfo::SetSuccessor
          (PathTypeSingleSuccessorInfo *this,DynamicType *type,PathTypeSuccessorKey key,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef,ScriptContext *scriptContext)

{
  Type *addr;
  long lVar1;
  PathTypeSuccessorKey key_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  PathTypeMultiSuccessorInfo *this_00;
  PathTypeHandlerBase *pPVar5;
  DynamicType *type_00;
  ScriptContext *scriptContext_00;
  
  addr = &this->successorTypeWeakRef;
  type_00 = (DynamicType *)(this->successorTypeWeakRef).ptr;
  if ((type_00 == (DynamicType *)0x0) ||
     (lVar1._0_4_ = (type_00->super_Type).typeId, lVar1._4_1_ = (type_00->super_Type).flags,
     lVar1._5_3_ = *(undefined3 *)&(type_00->super_Type).field_0x5, lVar1 == 0)) {
    (this->successorKey).propertyId = key.propertyId;
    (this->successorKey).attributes = key.attributes;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->successorTypeWeakRef).ptr = typeWeakRef;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    return;
  }
  if (((this->successorKey).propertyId == key.propertyId) &&
     ((this->successorKey).attributes == key.attributes)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x9c,"(key != successorKey)","key != successorKey");
    if (!bVar3) goto LAB_00dbc121;
    *puVar4 = 0;
    type_00 = (DynamicType *)addr->ptr;
  }
  key_00.propertyId = (this->successorKey).propertyId;
  key_00.attributes = (this->successorKey).attributes;
  key_00._5_3_ = *(undefined3 *)&(this->successorKey).field_0x5;
  scriptContext_00 = scriptContext;
  this_00 = PathTypeMultiSuccessorInfo::New
                      (key_00,(RecyclerWeakReference<Js::DynamicType> *)type_00,scriptContext);
  PathTypeMultiSuccessorInfo::SetSuccessor(this_00,type_00,key,typeWeakRef,scriptContext_00);
  pPVar5 = PathTypeHandlerBase::FromTypeHandler((type->typeHandler).ptr);
  if ((PathTypeSingleSuccessorInfo *)(pPVar5->successorInfo).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xa1,
                                "(PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler())->GetSuccessorInfo() == this)"
                                ,
                                "PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler())->GetSuccessorInfo() == this"
                               );
    if (!bVar3) {
LAB_00dbc121:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pPVar5 = PathTypeHandlerBase::FromTypeHandler((type->typeHandler).ptr);
  Memory::Recycler::WBSetBit((char *)&pPVar5->successorInfo);
  (pPVar5->successorInfo).ptr = &this_00->super_PathTypeSuccessorInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pPVar5->successorInfo);
  scriptContext->convertSimplePathToPathCount = scriptContext->convertSimplePathToPathCount + 1;
  return;
}

Assistant:

void PathTypeSingleSuccessorInfo::SetSuccessor(DynamicType * type, const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef, ScriptContext * scriptContext)
    {
        if (!successorTypeWeakRef || !successorTypeWeakRef->Get())
        {
            successorKey = key;
            successorTypeWeakRef = typeWeakRef;
            return;
        }

        Assert(key != successorKey);

        PathTypeMultiSuccessorInfo * newInfo = PathTypeMultiSuccessorInfo::New(this->successorKey, this->successorTypeWeakRef, scriptContext);
        newInfo->SetSuccessor(type, key, typeWeakRef, scriptContext);

        Assert(PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler())->GetSuccessorInfo() == this);
        PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler())->SetSuccessorInfo(newInfo);

#ifdef PROFILE_TYPES
        scriptContext->convertSimplePathToPathCount++;
#endif
    }